

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O2

void __thiscall
CTestResource_Test2DLinearResource_Test::TestBody(CTestResource_Test2DLinearResource_Test *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  GMM_RESOURCE_INFO *pGVar3;
  uint uVar4;
  uint32_t i_1;
  uint uVar5;
  uint32_t i;
  TEST_BPP TVar6;
  undefined8 uStack_b8;
  GMM_RESCREATE_PARAMS gmmParams;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_b8 = 2;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x80000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  for (TVar6 = TEST_BPP_8; TVar6 != TEST_BPP_MAX; TVar6 = TVar6 + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat(&this->super_CTestResource,TVar6);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    gmmParams.CpTag = 1;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_b8);
    uVar5 = gmmParams.CpTag + 0xf;
    uVar4 = gmmParams.field_6.BaseWidth + 3;
    uVar2 = CTestResource::GetBppValue(&this->super_CTestResource,TVar6);
    uVar5 = (uVar5 & 0xfffffff0) * uVar2;
    if (uVar5 < 0x21) {
      uVar5 = 0x20;
    }
    uVar5 = uVar5 + 0x3f & 0xffffffc0;
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar3,uVar5);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,pGVar3,
               (ulong)((uVar4 & 0xfffffffc) * uVar5 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  for (TVar6 = TEST_BPP_8; TVar6 != TEST_BPP_MAX; TVar6 = TVar6 + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat(&this->super_CTestResource,TVar6);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    gmmParams.CpTag = 0x100;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 0x100;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_b8);
    uVar5 = gmmParams.CpTag + 0xf;
    uVar4 = gmmParams.field_6.BaseWidth + 3;
    uVar2 = CTestResource::GetBppValue(&this->super_CTestResource,TVar6);
    uVar5 = (uVar5 & 0xfffffff0) * uVar2;
    if (uVar5 < 0x21) {
      uVar5 = 0x20;
    }
    uVar5 = uVar5 + 0x3f & 0xffffffc0;
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar3,uVar5);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,pGVar3,
               (ulong)((uVar4 & 0xfffffffc) * uVar5 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  return;
}

Assistant:

TEST_F(CTestResource, Test2DLinearResource)
{
    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 256 x 256
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 256;
        gmmParams.BaseHeight  = 256;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}